

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollable.c
# Opt level: O3

int nni_pollable_getfd(nni_pollable *p,int *fdp)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  uint local_30;
  int local_2c;
  int rfd;
  int wfd;
  
  if (p == (nni_pollable *)0x0) {
    return 3;
  }
  uVar3 = nni_atomic_get64(&p->p_fds);
  if (uVar3 == 0xffffffffffffffff) {
    while (iVar2 = nni_plat_pipe_open(&local_2c,(int *)&local_30), iVar2 == 0) {
      _Var1 = nni_atomic_cas64(&p->p_fds,0xffffffffffffffff,
                               ((ulong)local_30 << 0x20) + (long)local_2c);
      if (_Var1) {
        _Var1 = nni_atomic_get_bool(&p->p_raised);
        if (_Var1) {
          nni_plat_pipe_raise(local_2c);
        }
        goto LAB_00129eff;
      }
      nni_plat_pipe_close(local_2c,local_30);
      uVar3 = nni_atomic_get64(&p->p_fds);
      if (uVar3 != 0xffffffffffffffff) goto LAB_00129efb;
    }
  }
  else {
LAB_00129efb:
    local_30 = (uint)(uVar3 >> 0x20);
LAB_00129eff:
    *fdp = local_30;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nni_pollable_getfd(nni_pollable *p, int *fdp)
{
	if (p == NULL) {
		return (NNG_EINVAL);
	}

	for (;;) {
		int      rfd;
		int      wfd;
		int      rv;
		uint64_t fds;

		if ((fds = nni_atomic_get64(&p->p_fds)) != (uint64_t) -1) {
			*fdp = RFD(fds);
			return (0);
		}
		if ((rv = nni_plat_pipe_open(&wfd, &rfd)) != 0) {
			return (rv);
		}
		fds = FD_JOIN(wfd, rfd);

		if (nni_atomic_cas64(&p->p_fds, (uint64_t) -1, fds)) {
			if (nni_atomic_get_bool(&p->p_raised)) {
				nni_plat_pipe_raise(wfd);
			}
			*fdp = rfd;
			return (0);
		}

		// Someone beat us.  Close ours, and try again.
		nni_plat_pipe_close(wfd, rfd);
	}
}